

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_cast.cpp
# Opt level: O1

string_t duckdb::StringCast::Operation<duckdb::dtime_t>(dtime_t input,Vector *vector)

{
  Vector *vector_00;
  ulong uVar1;
  idx_t len;
  char *data;
  string_t result;
  int32_t time [4];
  char micro_buffer [10];
  undefined1 local_58 [16];
  int32_t local_48;
  int32_t local_44;
  int32_t local_40;
  int32_t local_3c [3];
  char local_30 [16];
  
  Time::Convert(input,&local_48,&local_44,&local_40,local_3c);
  local_30[8] = '\0';
  local_30[9] = '\0';
  local_30[0] = '\0';
  local_30[1] = '\0';
  local_30[2] = '\0';
  local_30[3] = '\0';
  local_30[4] = '\0';
  local_30[5] = '\0';
  local_30[6] = '\0';
  local_30[7] = '\0';
  vector_00 = (Vector *)TimeToStringCast::MicrosLength(local_3c[0],local_30);
  local_58 = (undefined1  [16])StringVector::EmptyString((StringVector *)vector,vector_00,len);
  data = local_58._8_8_;
  if (local_58._0_4_ < 0xd) {
    data = local_58 + 4;
  }
  TimeToStringCast::Format(data,(idx_t)vector_00,local_48,local_44,local_40,local_3c[0],local_30);
  uVar1 = (ulong)(uint)local_58._0_4_;
  if (uVar1 < 0xd) {
    switchD_0105b559::default(local_58 + 4 + uVar1,0,0xc - uVar1);
  }
  else {
    local_58._4_4_ = *(undefined4 *)local_58._8_8_;
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_58;
}

Assistant:

duckdb::string_t StringCast::Operation(dtime_t input, Vector &vector) {
	int32_t time[4];
	Time::Convert(input, time[0], time[1], time[2], time[3]);

	char micro_buffer[10] = {};
	idx_t length = TimeToStringCast::Length(time, micro_buffer);

	string_t result = StringVector::EmptyString(vector, length);
	auto data = result.GetDataWriteable();

	TimeToStringCast::Format(data, length, time, micro_buffer);

	result.Finalize();
	return result;
}